

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O1

vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
* cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::find_word_endings
            (vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,Iterator first,Iterator last)

{
  pointer *pp_Var1;
  char cVar2;
  iterator iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (first._M_current != last._M_current) {
    bVar4 = false;
    bVar5 = false;
    do {
      cVar2 = *first._M_current;
      bVar7 = (byte)(cVar2 + 0xbfU) < 0x1a;
      bVar8 = (byte)(cVar2 - 0x30U) < 10;
      bVar9 = (byte)(cVar2 + 0x9fU) < 0x1a;
      bVar6 = (bVar9 || bVar8) || bVar7;
      if ((bVar5) && (!(bool)((bVar4 | 0x19 < (byte)(cVar2 + 0xbfU)) & bVar6))) {
        local_38._M_current = first._M_current + -1;
        iVar3._M_current =
             (__return_storage_ptr__->
             super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,std::allocator<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                    ((vector<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,std::allocator<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>>
                      *)__return_storage_ptr__,iVar3,&local_38);
        }
        else {
          (iVar3._M_current)->_M_current = local_38._M_current;
          pp_Var1 = &(__return_storage_ptr__->
                     super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *pp_Var1 = *pp_Var1 + 1;
        }
      }
      first._M_current = first._M_current + 1;
      bVar4 = bVar7;
      bVar5 = bVar6;
    } while (first._M_current != last._M_current);
    if ((bVar9 || bVar8) || bVar7) {
      local_38._M_current = last._M_current + -1;
      iVar3._M_current =
           (__return_storage_ptr__->
           super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,std::allocator<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>>
        ::
        _M_realloc_insert<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                  ((vector<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,std::allocator<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>>
                    *)__return_storage_ptr__,iVar3,&local_38);
      }
      else {
        (iVar3._M_current)->_M_current = local_38._M_current;
        pp_Var1 = &(__return_storage_ptr__->
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Iterator> find_word_endings(Iterator const first,
                                                 Iterator const last) {
    std::vector<Iterator> word_ends;
    bool prev_uppercase = false;
    bool prev_alphanumeric = false;
    for (auto it = first; it != last; ++it) {
      auto const c = *it;
      bool const next_uppercase = StringTraits::is_uppercase(c);
      bool const next_alphanumeric = StringTraits::is_alphanumeric(c);
      if (prev_alphanumeric &&
          (!next_alphanumeric || (!prev_uppercase && next_uppercase))) {
        word_ends.push_back(it - 1);
      }
      prev_uppercase = next_uppercase;
      prev_alphanumeric = next_alphanumeric;
    }
    if (prev_alphanumeric) {
      word_ends.push_back(last - 1);
    }
    return word_ends;
  }